

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspec.c
# Opt level: O3

void apet_force(CHAR_DATA *ch,char *cmd,int delay)

{
  short sVar1;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string buffer;
  CHAR_DATA *local_300;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  char *local_258 [2];
  undefined1 local_248 [32];
  char local_228 [504];
  
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_0044b3a0;
  local_248._24_8_ = 500;
  fmt.size_ = 0x2a;
  fmt.data_ = "You feel the irresistible urge to \'{}}\'.\n\r";
  args.field_1.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_258
  ;
  args.desc_ = 0xc;
  local_300 = ch;
  local_258[0] = cmd;
  local_248._8_8_ = local_228;
  ::fmt::v9::detail::vformat_to<char>((buffer<char> *)local_248,fmt,args,(locale_ref)0x0);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_,local_248._24_8_);
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"apet_force","");
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"interpret_queue","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_248,cmd,(allocator<char> *)local_258);
  CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string>
            (&RS.Queue,delay,&local_298,&local_2b8,interpret_queue,&local_300,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"apet_force","");
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"send_to_char_queue","");
  CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),std::__cxx11::string&,char_data*&>
            (&RS.Queue,delay,&local_2d8,&local_2f8,send_to_char_queue,&local_278,&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  sVar1 = 0x14;
  if (local_300->wait < 0x14) {
    sVar1 = local_300->wait;
  }
  local_300->wait = sVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void apet_force(CHAR_DATA *ch, const char *cmd, int delay)
{
	char *tcmd;

	auto buffer = fmt::format("You feel the irresistible urge to '{}}'.\n\r", cmd);

	RS.Queue.AddToQueue(delay, "apet_force", "interpret_queue", interpret_queue, ch, std::string(cmd));
	RS.Queue.AddToQueue(delay, "apet_force", "send_to_char_queue", send_to_char_queue, buffer, ch);

	ch->wait = std::min((int)ch->wait, 20);
}